

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::getElementAttValue
          (TraverseSchema *this,DOMElement *elem,XMLCh *attName,ValidatorType attType)

{
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  short sVar4;
  ulong uVar5;
  undefined2 *puVar6;
  XMLStringPool *pXVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  XMLCh *toCheck;
  ulong uVar12;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  long lVar13;
  MemoryManager *manager;
  long lVar14;
  ushort *puVar15;
  size_t __n;
  ArrayJanitor<char16_t> tempName;
  ArrayJanitor<char16_t> AStack_38;
  long *plVar11;
  undefined4 extraout_var_00;
  
  iVar9 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,attName);
  plVar11 = (long *)CONCAT44(extraout_var,iVar9);
  if (plVar11 == (long *)0x0) {
    toCheck = (XMLCh *)0x0;
  }
  else {
    toCheck = (XMLCh *)(**(code **)(*plVar11 + 0x150))(plVar11);
    if ((int)attType < 0x14) {
      if (getElementAttValue(xercesc_4_0::DOMElement_const*,char16_t_const*,xercesc_4_0::DatatypeValidator::ValidatorType)
          ::bInitialized == '\0') {
        getElementAttValue(xercesc_4_0::DOMElement_const*,char16_t_const*,xercesc_4_0::DatatypeValidator::ValidatorType)
        ::bInitialized = '\x01';
        uVar5 = *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18);
        uVar12 = 0x73;
        uVar3 = 0x74;
        puVar15 = &DAT_003689c4;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        lVar13 = *(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_STRING) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_STRING + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f40a;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f40a:
        getElementAttValue::wsFacets[0] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x61;
        uVar3 = 0x6e;
        puVar15 = &DAT_00368c9e;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_ANYURI) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_ANYURI + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f4b5;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f4b5:
        getElementAttValue::wsFacets[1] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x51;
        uVar3 = 0x4e;
        puVar15 = &DAT_00368cac;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_QNAME) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_QNAME + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f560;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f560:
        getElementAttValue::wsFacets[2] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x4e;
        uVar3 = 0x61;
        puVar15 = &DAT_003689f6;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_NAME) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_NAME + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f60b;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f60b:
        getElementAttValue::wsFacets[3] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x4e;
        uVar3 = 0x43;
        puVar15 = &DAT_00368a00;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_NCNAME) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_NCNAME + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f6b6;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f6b6:
        getElementAttValue::wsFacets[4] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x62;
        uVar3 = 0x6f;
        puVar15 = &DAT_00368a34;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_BOOLEAN) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_BOOLEAN + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f761;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f761:
        getElementAttValue::wsFacets[5] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x66;
        uVar3 = 0x6c;
        puVar15 = &DAT_00368c68;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_FLOAT) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_FLOAT + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f80c;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f80c:
        getElementAttValue::wsFacets[6] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x6f;
        puVar15 = &DAT_00368c74;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_DOUBLE) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DOUBLE + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f8b7;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f8b7:
        getElementAttValue::wsFacets[7] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x65;
        puVar15 = &DAT_00368a24;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_DECIMAL) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DECIMAL + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031f962;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031f962:
        getElementAttValue::wsFacets[8] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x68;
        uVar3 = 0x65;
        puVar15 = &DAT_00368c54;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_HEXBINARY) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_HEXBINARY + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fa0d;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fa0d:
        getElementAttValue::wsFacets[9] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x62;
        uVar3 = 0x61;
        puVar15 = &DAT_00368c34;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_BASE64BINARY) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_BASE64BINARY + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fab8;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fab8:
        getElementAttValue::wsFacets[10] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x75;
        puVar15 = &DAT_00368bc4;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_DURATION) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DURATION + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fb63;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fb63:
        getElementAttValue::wsFacets[0xb] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x61;
        puVar15 = &DAT_00368b94;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_DATETIME) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DATETIME + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fc0e;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fc0e:
        getElementAttValue::wsFacets[0xc] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x61;
        puVar15 = &DAT_00368ba6;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_DATE) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DATE + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fcb9;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fcb9:
        getElementAttValue::wsFacets[0xd] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x74;
        uVar3 = 0x69;
        puVar15 = &DAT_00368bb0;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_TIME) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_TIME + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fd64;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fd64:
        getElementAttValue::wsFacets[0xe] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x4d;
        puVar15 = &DAT_00368bf4;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_MONTHDAY) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_MONTHDAY + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031fe0f;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031fe0f:
        getElementAttValue::wsFacets[0xf] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x59;
        puVar15 = &DAT_00368c14;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_YEARMONTH) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_YEARMONTH + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031feba;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031feba:
        getElementAttValue::wsFacets[0x10] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x59;
        puVar15 = &DAT_00368c08;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_YEAR) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_YEAR + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_0031ff65;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_0031ff65:
        getElementAttValue::wsFacets[0x11] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x4d;
        puVar15 = &DAT_00368be0;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_MONTH) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_MONTH + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_00320010;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_00320010:
        getElementAttValue::wsFacets[0x12] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x44;
        puVar15 = &DAT_00368bd6;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar5) * 8);
        puVar6 = (undefined2 *)plVar11[2];
        while (puVar6 != &SchemaSymbols::fgDT_DAY) {
          if (puVar6 != (undefined2 *)0x0) {
            lVar13 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DAY + lVar13);
              if (*psVar1 == 0) {
                if (*(short *)((long)puVar6 + lVar13) == 0) goto LAB_003200b6;
                break;
              }
              psVar2 = (short *)((long)puVar6 + lVar13);
              lVar13 = lVar13 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar6 = (undefined2 *)plVar11[2];
        }
LAB_003200b6:
        getElementAttValue::wsFacets[0x13] = *(short *)(*plVar11 + 0xc);
      }
      sVar4 = getElementAttValue::wsFacets[attType];
      if (sVar4 == 1) {
        bVar8 = XMLString::isWSReplaced(toCheck);
      }
      else {
        if (sVar4 != 2) {
          return toCheck;
        }
        bVar8 = XMLString::isWSCollapsed(toCheck);
      }
      if (bVar8 == false) {
        manager = this->fMemoryManager;
        if (toCheck == (XMLCh *)0x0) {
          toDelete = (XMLCh *)0x0;
        }
        else {
          __n = 0;
          do {
            psVar1 = (short *)((long)toCheck + __n);
            __n = __n + 2;
          } while (*psVar1 != 0);
          iVar9 = (*manager->_vptr_MemoryManager[3])(manager,__n);
          toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar9);
          memcpy(toDelete,toCheck,__n);
          manager = this->fMemoryManager;
        }
        ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,toDelete,manager);
        if (sVar4 == 1) {
          XMLString::replaceWS(toDelete,this->fMemoryManager);
        }
        else if (sVar4 == 2) {
          XMLString::collapseWS(toDelete,this->fMemoryManager);
        }
        if (*toDelete == L'\0') {
          toCheck = L"";
        }
        else {
          pXVar7 = this->fStringPool;
          uVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,toDelete);
          iVar9 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar10);
          toCheck = (XMLCh *)CONCAT44(extraout_var_01,iVar9);
        }
        ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
      }
    }
  }
  return toCheck;
}

Assistant:

const XMLCh* TraverseSchema::getElementAttValue(const DOMElement* const elem,
                                                const XMLCh* const attName,
                                                const DatatypeValidator::ValidatorType attType /* = UnKnown */) {

    DOMAttr* attNode = elem->getAttributeNode(attName);

    if (attNode == 0) {
        return 0;
    }

    const XMLCh* attValue = attNode->getValue();

    if (attType < DatatypeValidator::ID) {
        static bool bInitialized = false;
        static short wsFacets[DatatypeValidator::ID] = {0};
        if(!bInitialized)
        {
            bInitialized=true;
            DVHashTable* registry = DatatypeValidatorFactory::getBuiltInRegistry();
            wsFacets[DatatypeValidator::String]      = registry->get(SchemaSymbols::fgDT_STRING)->getWSFacet();
            wsFacets[DatatypeValidator::AnyURI]      = registry->get(SchemaSymbols::fgDT_ANYURI)->getWSFacet();
            wsFacets[DatatypeValidator::QName]       = registry->get(SchemaSymbols::fgDT_QNAME)->getWSFacet();
            wsFacets[DatatypeValidator::Name]        = registry->get(SchemaSymbols::fgDT_NAME)->getWSFacet();
            wsFacets[DatatypeValidator::NCName]      = registry->get(SchemaSymbols::fgDT_NCNAME)->getWSFacet();
            wsFacets[DatatypeValidator::Boolean]     = registry->get(SchemaSymbols::fgDT_BOOLEAN)->getWSFacet();
            wsFacets[DatatypeValidator::Float]       = registry->get(SchemaSymbols::fgDT_FLOAT)->getWSFacet();
            wsFacets[DatatypeValidator::Double]      = registry->get(SchemaSymbols::fgDT_DOUBLE)->getWSFacet();
            wsFacets[DatatypeValidator::Decimal]     = registry->get(SchemaSymbols::fgDT_DECIMAL)->getWSFacet();
            wsFacets[DatatypeValidator::HexBinary]   = registry->get(SchemaSymbols::fgDT_HEXBINARY)->getWSFacet();
            wsFacets[DatatypeValidator::Base64Binary]= registry->get(SchemaSymbols::fgDT_BASE64BINARY)->getWSFacet();
            wsFacets[DatatypeValidator::Duration]    = registry->get(SchemaSymbols::fgDT_DURATION)->getWSFacet();
            wsFacets[DatatypeValidator::DateTime]    = registry->get(SchemaSymbols::fgDT_DATETIME)->getWSFacet();
            wsFacets[DatatypeValidator::Date]        = registry->get(SchemaSymbols::fgDT_DATE)->getWSFacet();
            wsFacets[DatatypeValidator::Time]        = registry->get(SchemaSymbols::fgDT_TIME)->getWSFacet();
            wsFacets[DatatypeValidator::MonthDay]    = registry->get(SchemaSymbols::fgDT_MONTHDAY)->getWSFacet();
            wsFacets[DatatypeValidator::YearMonth]   = registry->get(SchemaSymbols::fgDT_YEARMONTH)->getWSFacet();
            wsFacets[DatatypeValidator::Year]        = registry->get(SchemaSymbols::fgDT_YEAR)->getWSFacet();
            wsFacets[DatatypeValidator::Month]       = registry->get(SchemaSymbols::fgDT_MONTH)->getWSFacet();
            wsFacets[DatatypeValidator::Day]         = registry->get(SchemaSymbols::fgDT_DAY)->getWSFacet();
        }
        short wsFacet = wsFacets[attType];
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(attValue)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(attValue)))
        {
            XMLCh* normalizedValue=XMLString::replicate(attValue, fMemoryManager);
            ArrayJanitor<XMLCh> tempName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            if (!*normalizedValue)
                return XMLUni::fgZeroLenString;
            return fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
    }

    return attValue;
}